

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseAnnotation(Parser *this,Annotation *annotation)

{
  pointer pcVar1;
  bool bVar2;
  string name;
  Value value;
  string local_d0;
  Value local_b0;
  Value local_70;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x263762);
  if (bVar2) {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x26346e);
    if (!bVar2) {
      do {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x263707);
        if (bVar2) {
          pcVar1 = (this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ).currentStringValue._M_dataplus._M_p;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,
                     pcVar1 + (this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ).currentStringValue._M_string_length);
        }
        else {
          readGeneralIdentifier_abi_cxx11_(&local_d0,this);
        }
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x262bf0);
        if (bVar2) {
          parseAnnotationValue(&local_70,this);
        }
        else {
          soul::Value::Value(&local_70,true);
        }
        soul::Value::Value(&local_b0,&local_70);
        Annotation::set(annotation,&local_d0,&local_b0,&((this->program).pimpl)->stringDictionary);
        soul::Value::~Value(&local_b0);
        soul::Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x26375e);
      } while (bVar2);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x26346e);
    }
  }
  return;
}

Assistant:

void parseAnnotation (Annotation& annotation)
    {
        if (matchIf (HEARTOperator::openDoubleBracket))
        {
            if (matchIf (HEARTOperator::closeDoubleBracket))
                return;

            do
            {
                auto name  = matchIf (Token::literalString) ? currentStringValue : readGeneralIdentifier();
                auto value = matchIf (HEARTOperator::colon) ? parseAnnotationValue() : Value (true);

                annotation.set (name, value, program.getStringDictionary());
            }
            while (matchIf (HEARTOperator::comma));

            expect (HEARTOperator::closeDoubleBracket);
        }
    }